

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl3cGPUShader5Tests.cpp
# Opt level: O0

string * __thiscall
gl3cts::GPUShader5ImplicitConversionsTest::getVertexShader_abi_cxx11_
          (string *__return_storage_ptr__,GPUShader5ImplicitConversionsTest *this,
          GLchar *destination_type,GLchar *source_type)

{
  int iVar1;
  size_t local_50;
  size_t search_position;
  allocator<char> local_32;
  undefined1 local_31;
  char *local_30;
  char *vs_body_template;
  GLchar *source_type_local;
  GLchar *destination_type_local;
  GPUShader5ImplicitConversionsTest *this_local;
  string *vs_body;
  
  local_30 = 
  "#version 130\n#extension GL_ARB_gpu_shader5 : require\n\nuniform SOURCE_TYPE u1;\nuniform SOURCE_TYPE u2;\n\nout     vec4 result;\n\nvoid main()\n{\n    DESTINATION_TYPE v = ZERO;\n\n    v = DESTINATION_TYPE(u2) - u1;\n\n    result = vec4(0.0, 0.0, 0.0, 0.0);\n    if (ZERO == v)\n    {\n      result = vec4(1.0, 1.0, 1.0, 1.0);\n    }\n\n    switch (gl_VertexID)\n    {\n      case 0: gl_Position = vec4(-1.0, 1.0, 0.0, 1.0); break; \n      case 1: gl_Position = vec4( 1.0, 1.0, 0.0, 1.0); break; \n      case 2: gl_Position = vec4(-1.0,-1.0, 0.0, 1.0); break; \n      case 3: gl_Position = vec4( 1.0,-1.0, 0.0, 1.0); break; \n    }\n}\n\n"
  ;
  local_31 = 0;
  vs_body_template = source_type;
  source_type_local = destination_type;
  destination_type_local = (GLchar *)this;
  this_local = (GPUShader5ImplicitConversionsTest *)__return_storage_ptr__;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)__return_storage_ptr__,
             "#version 130\n#extension GL_ARB_gpu_shader5 : require\n\nuniform SOURCE_TYPE u1;\nuniform SOURCE_TYPE u2;\n\nout     vec4 result;\n\nvoid main()\n{\n    DESTINATION_TYPE v = ZERO;\n\n    v = DESTINATION_TYPE(u2) - u1;\n\n    result = vec4(0.0, 0.0, 0.0, 0.0);\n    if (ZERO == v)\n    {\n      result = vec4(1.0, 1.0, 1.0, 1.0);\n    }\n\n    switch (gl_VertexID)\n    {\n      case 0: gl_Position = vec4(-1.0, 1.0, 0.0, 1.0); break; \n      case 1: gl_Position = vec4( 1.0, 1.0, 0.0, 1.0); break; \n      case 2: gl_Position = vec4(-1.0,-1.0, 0.0, 1.0); break; \n      case 3: gl_Position = vec4( 1.0,-1.0, 0.0, 1.0); break; \n    }\n}\n\n"
             ,&local_32);
  std::allocator<char>::~allocator(&local_32);
  local_50 = 0;
  Utils::replaceToken("SOURCE_TYPE",&local_50,vs_body_template,__return_storage_ptr__);
  Utils::replaceToken("SOURCE_TYPE",&local_50,vs_body_template,__return_storage_ptr__);
  local_50 = 0;
  Utils::replaceToken("DESTINATION_TYPE",&local_50,source_type_local,__return_storage_ptr__);
  Utils::replaceToken("DESTINATION_TYPE",&local_50,source_type_local,__return_storage_ptr__);
  local_50 = 0;
  iVar1 = strcmp(source_type_local,"int");
  if ((iVar1 == 0) || (iVar1 = strcmp(source_type_local,"uint"), iVar1 == 0)) {
    Utils::replaceToken("ZERO",&local_50,"0",__return_storage_ptr__);
    Utils::replaceToken("ZERO",&local_50,"0",__return_storage_ptr__);
  }
  else {
    iVar1 = strcmp(source_type_local,"float");
    if (iVar1 == 0) {
      Utils::replaceToken("ZERO",&local_50,"0.0",__return_storage_ptr__);
      Utils::replaceToken("ZERO",&local_50,"0.0",__return_storage_ptr__);
    }
    else {
      iVar1 = strcmp(source_type_local,"ivec2");
      if (iVar1 == 0) {
        Utils::replaceToken("ZERO",&local_50,"ivec2(0,0)",__return_storage_ptr__);
        Utils::replaceToken("ZERO",&local_50,"ivec2(0,0)",__return_storage_ptr__);
      }
      else {
        iVar1 = strcmp(source_type_local,"ivec3");
        if (iVar1 == 0) {
          Utils::replaceToken("ZERO",&local_50,"ivec3(0,0,0)",__return_storage_ptr__);
          Utils::replaceToken("ZERO",&local_50,"ivec3(0,0,0)",__return_storage_ptr__);
        }
        else {
          iVar1 = strcmp(source_type_local,"ivec4");
          if (iVar1 == 0) {
            Utils::replaceToken("ZERO",&local_50,"ivec4(0,0,0,0)",__return_storage_ptr__);
            Utils::replaceToken("ZERO",&local_50,"ivec4(0,0,0,0)",__return_storage_ptr__);
          }
          else {
            iVar1 = strcmp(source_type_local,"uvec2");
            if (iVar1 == 0) {
              Utils::replaceToken("ZERO",&local_50,"uvec2(0,0)",__return_storage_ptr__);
              Utils::replaceToken("ZERO",&local_50,"uvec2(0,0)",__return_storage_ptr__);
            }
            else {
              iVar1 = strcmp(source_type_local,"uvec3");
              if (iVar1 == 0) {
                Utils::replaceToken("ZERO",&local_50,"uvec3(0,0,0)",__return_storage_ptr__);
                Utils::replaceToken("ZERO",&local_50,"uvec3(0,0,0)",__return_storage_ptr__);
              }
              else {
                iVar1 = strcmp(source_type_local,"uvec4");
                if (iVar1 == 0) {
                  Utils::replaceToken("ZERO",&local_50,"uvec4(0,0,0,0)",__return_storage_ptr__);
                  Utils::replaceToken("ZERO",&local_50,"uvec4(0,0,0,0)",__return_storage_ptr__);
                }
                else {
                  iVar1 = strcmp(source_type_local,"vec2");
                  if (iVar1 == 0) {
                    Utils::replaceToken("ZERO",&local_50,"vec2(0,0)",__return_storage_ptr__);
                    Utils::replaceToken("ZERO",&local_50,"vec2(0,0)",__return_storage_ptr__);
                  }
                  else {
                    iVar1 = strcmp(source_type_local,"vec3");
                    if (iVar1 == 0) {
                      Utils::replaceToken("ZERO",&local_50,"vec3(0,0,0)",__return_storage_ptr__);
                      Utils::replaceToken("ZERO",&local_50,"vec3(0,0,0)",__return_storage_ptr__);
                    }
                    else {
                      iVar1 = strcmp(source_type_local,"vec4");
                      if (iVar1 == 0) {
                        Utils::replaceToken("ZERO",&local_50,"vec4(0,0,0,0)",__return_storage_ptr__)
                        ;
                        Utils::replaceToken("ZERO",&local_50,"vec4(0,0,0,0)",__return_storage_ptr__)
                        ;
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::string GPUShader5ImplicitConversionsTest::getVertexShader(const glw::GLchar* destination_type,
															   const glw::GLchar* source_type)
{
	/* Vertex shader template */
	const char* vs_body_template = "#version 130\n"
								   "#extension GL_ARB_gpu_shader5 : require\n"
								   "\n"
								   "uniform SOURCE_TYPE u1;\n"
								   "uniform SOURCE_TYPE u2;\n"
								   "\n"
								   "out     vec4 result;\n"
								   "\n"
								   "void main()\n"
								   "{\n"
								   "    DESTINATION_TYPE v = ZERO;\n"
								   "\n"
								   "    v = DESTINATION_TYPE(u2) - u1;\n"
								   "\n"
								   "    result = vec4(0.0, 0.0, 0.0, 0.0);\n"
								   "    if (ZERO == v)\n"
								   "    {\n"
								   "      result = vec4(1.0, 1.0, 1.0, 1.0);\n"
								   "    }\n"
								   "\n"
								   "    switch (gl_VertexID)\n"
								   "    {\n"
								   "      case 0: gl_Position = vec4(-1.0, 1.0, 0.0, 1.0); break; \n"
								   "      case 1: gl_Position = vec4( 1.0, 1.0, 0.0, 1.0); break; \n"
								   "      case 2: gl_Position = vec4(-1.0,-1.0, 0.0, 1.0); break; \n"
								   "      case 3: gl_Position = vec4( 1.0,-1.0, 0.0, 1.0); break; \n"
								   "    }\n"
								   "}\n"
								   "\n";

	std::string vs_body = vs_body_template;

	/* Tokens */
	size_t search_position = 0;

	Utils::replaceToken("SOURCE_TYPE", search_position, source_type, vs_body);
	Utils::replaceToken("SOURCE_TYPE", search_position, source_type, vs_body);

	search_position = 0;
	Utils::replaceToken("DESTINATION_TYPE", search_position, destination_type, vs_body);
	Utils::replaceToken("DESTINATION_TYPE", search_position, destination_type, vs_body);

	search_position = 0;
	if (!strcmp(destination_type, "int") || !strcmp(destination_type, "uint"))
	{
		Utils::replaceToken("ZERO", search_position, "0", vs_body);
		Utils::replaceToken("ZERO", search_position, "0", vs_body);
	}
	else if (!strcmp(destination_type, "float"))
	{
		Utils::replaceToken("ZERO", search_position, "0.0", vs_body);
		Utils::replaceToken("ZERO", search_position, "0.0", vs_body);
	}
	else if (!strcmp(destination_type, "ivec2"))
	{
		Utils::replaceToken("ZERO", search_position, "ivec2(0,0)", vs_body);
		Utils::replaceToken("ZERO", search_position, "ivec2(0,0)", vs_body);
	}
	else if (!strcmp(destination_type, "ivec3"))
	{
		Utils::replaceToken("ZERO", search_position, "ivec3(0,0,0)", vs_body);
		Utils::replaceToken("ZERO", search_position, "ivec3(0,0,0)", vs_body);
	}
	else if (!strcmp(destination_type, "ivec4"))
	{
		Utils::replaceToken("ZERO", search_position, "ivec4(0,0,0,0)", vs_body);
		Utils::replaceToken("ZERO", search_position, "ivec4(0,0,0,0)", vs_body);
	}
	else if (!strcmp(destination_type, "uvec2"))
	{
		Utils::replaceToken("ZERO", search_position, "uvec2(0,0)", vs_body);
		Utils::replaceToken("ZERO", search_position, "uvec2(0,0)", vs_body);
	}
	else if (!strcmp(destination_type, "uvec3"))
	{
		Utils::replaceToken("ZERO", search_position, "uvec3(0,0,0)", vs_body);
		Utils::replaceToken("ZERO", search_position, "uvec3(0,0,0)", vs_body);
	}
	else if (!strcmp(destination_type, "uvec4"))
	{
		Utils::replaceToken("ZERO", search_position, "uvec4(0,0,0,0)", vs_body);
		Utils::replaceToken("ZERO", search_position, "uvec4(0,0,0,0)", vs_body);
	}
	else if (!strcmp(destination_type, "vec2"))
	{
		Utils::replaceToken("ZERO", search_position, "vec2(0,0)", vs_body);
		Utils::replaceToken("ZERO", search_position, "vec2(0,0)", vs_body);
	}
	else if (!strcmp(destination_type, "vec3"))
	{
		Utils::replaceToken("ZERO", search_position, "vec3(0,0,0)", vs_body);
		Utils::replaceToken("ZERO", search_position, "vec3(0,0,0)", vs_body);
	}
	else if (!strcmp(destination_type, "vec4"))
	{
		Utils::replaceToken("ZERO", search_position, "vec4(0,0,0,0)", vs_body);
		Utils::replaceToken("ZERO", search_position, "vec4(0,0,0,0)", vs_body);
	}

	return vs_body;
}